

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_key.cpp
# Opt level: O2

OutputPrivkeyDataStruct *
cfd::js::api::KeyStructApi::NegatePrivkey
          (OutputPrivkeyDataStruct *__return_storage_ptr__,PrivkeyDataStruct *request)

{
  string *in_R8;
  allocator local_119;
  _Any_data local_118;
  code *local_108;
  code *local_100;
  function<cfd::js::api::OutputPrivkeyDataStruct_(const_cfd::js::api::PrivkeyDataStruct_&)> local_f8
  ;
  OutputPrivkeyDataStruct local_d8;
  
  OutputPrivkeyDataStruct::OutputPrivkeyDataStruct(__return_storage_ptr__);
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  local_100 = std::
              _Function_handler<cfd::js::api::OutputPrivkeyDataStruct_(const_cfd::js::api::PrivkeyDataStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_key.cpp:182:7)>
              ::_M_invoke;
  local_108 = std::
              _Function_handler<cfd::js::api::OutputPrivkeyDataStruct_(const_cfd::js::api::PrivkeyDataStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_key.cpp:182:7)>
              ::_M_manager;
  std::__cxx11::string::string((string *)&local_f8,"NegatePrivkey",&local_119);
  ExecuteStructApi<cfd::js::api::PrivkeyDataStruct,cfd::js::api::OutputPrivkeyDataStruct>
            (&local_d8,(api *)request,(PrivkeyDataStruct *)&local_118,&local_f8,in_R8);
  OutputPrivkeyDataStruct::operator=(__return_storage_ptr__,&local_d8);
  OutputPrivkeyDataStruct::~OutputPrivkeyDataStruct(&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_118);
  return __return_storage_ptr__;
}

Assistant:

OutputPrivkeyDataStruct KeyStructApi::NegatePrivkey(
    const PrivkeyDataStruct& request) {
  auto call_func =
      [](const PrivkeyDataStruct& request) -> OutputPrivkeyDataStruct {
    OutputPrivkeyDataStruct response;
    Privkey privkey;
    if (Privkey::HasWif(request.privkey)) {
      privkey = Privkey::FromWif(request.privkey);
    } else {
      privkey = Privkey(request.privkey);
    }
    response.privkey = privkey.CreateNegate().GetHex();
    return response;
  };

  OutputPrivkeyDataStruct result;
  result = ExecuteStructApi<PrivkeyDataStruct, OutputPrivkeyDataStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}